

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter.c
# Opt level: O0

void xml_reporter_start_test(TestReporter *reporter,char *testname)

{
  long lVar1;
  int iVar2;
  xmlNodePtr pxVar3;
  xmlChar *pxVar4;
  undefined8 uVar5;
  long in_RDI;
  char *unaff_retaddr;
  xmlOutputBufferPtr tmpfileBuf;
  xmlChar *xml_suite_path;
  xmlChar *xml_testname;
  xml_suite_context *ctx;
  XmlMemo_conflict *memo;
  char *in_stack_ffffffffffffffb8;
  TestReporter *in_stack_ffffffffffffffc0;
  FILE *pFVar6;
  _func_void_char_ptr_void_ptr *in_stack_ffffffffffffffc8;
  CgreenBreadcrumb *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_RDI + 0x88);
  iVar2 = context_stack_p + -1;
  pxVar3 = (xmlNodePtr)xmlNewChild(context_stack[iVar2].suite,0,"testcase");
  context_stack[iVar2].curTest = pxVar3;
  pxVar4 = xmlEscapePropValue(unaff_retaddr);
  xmlNewProp(context_stack[iVar2].curTest,"name",pxVar4);
  (*_xmlFree)(pxVar4);
  *(int *)(lVar1 + 8) = *(int *)(*(long *)(in_RDI + 0x78) + 8) + -1;
  suite_path[0] = '\0';
  walk_breadcrumb(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  pxVar4 = xmlEscapePropValue(unaff_retaddr);
  xmlNewProp(context_stack[iVar2].curTest,"classname",pxVar4);
  (*_xmlFree)(pxVar4);
  reporter_start_test(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  child_output_tmpfile = (FILE *)tmpfile();
  pFVar6 = (FILE *)child_output_tmpfile;
  uVar5 = xmlGetCharEncodingHandler(1);
  uVar5 = xmlOutputBufferCreateFile(pFVar6,uVar5);
  child_output_writer = (xmlTextWriterPtr)xmlNewTextWriter(uVar5);
  return;
}

Assistant:

static void xml_reporter_start_test(TestReporter *reporter, const char *testname) {
    XmlMemo *memo = (XmlMemo *)reporter->memo;
    struct xml_suite_context *ctx = &context_stack[context_stack_p-1];

    ctx->curTest = xmlNewChild(ctx->suite, NULL, XMLSTRING("testcase"), NULL);
    xmlChar *xml_testname = xmlEscapePropValue(testname);
    xmlNewProp(ctx->curTest, XMLSTRING("name"), xml_testname);
    xmlFree(xml_testname);

    memo->segment_count = reporter->breadcrumb->depth - 1;
    suite_path[0] = '\0';
    walk_breadcrumb(reporter->breadcrumb, print_path_segment_walker, memo);
    xmlChar* xml_suite_path = xmlEscapePropValue(suite_path);
    xmlNewProp(ctx->curTest, XMLSTRING("classname"), xml_suite_path);
    xmlFree(xml_suite_path);

    reporter_start_test(reporter, testname);

    child_output_tmpfile = tmpfile();
    xmlOutputBufferPtr tmpfileBuf
        = xmlOutputBufferCreateFile(child_output_tmpfile,
                                    xmlGetCharEncodingHandler(XML_CHAR_ENCODING_UTF8));
    child_output_writer = xmlNewTextWriter(tmpfileBuf);
}